

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_first_unused_segment_const(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> expect;
  array<int,_4UL> array;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  undefined8 local_38;
  int aiStack_30 [4];
  int local_20 [2];
  
  local_38 = 0x160000000b;
  aiStack_30[0] = 0;
  aiStack_30[1] = 0;
  local_20[0] = 0;
  local_20[1] = 0;
  __l._M_len = 2;
  __l._M_array = local_20;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x23c,"void api_dynamic_suite::dynamic_first_unused_segment_const()",aiStack_30,
             aiStack_30 + 2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_first_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}